

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShadersIsolines::countIsolines
          (TessellationShadersIsolines *this,_test_result *test_result)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> found_ys;
  float vertex_y;
  float *local_48;
  iterator iStack_40;
  float *local_38;
  float local_2c;
  
  local_48 = (float *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_38 = (float *)0x0;
  if (test_result->n_vertices != 0) {
    uVar4 = 0;
    do {
      local_2c = (test_result->rendered_data).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start[(ulong)(uint)((int)uVar4 * 3) + 1];
      if (local_48 == iStack_40._M_current) {
LAB_00d362cd:
        if (iStack_40._M_current == local_38) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_48,iStack_40,&local_2c);
        }
        else {
          *iStack_40._M_current = local_2c;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
      }
      else {
        bVar3 = false;
        pfVar1 = local_48;
        do {
          pfVar2 = pfVar1 + 1;
          fVar5 = local_2c - *pfVar1;
          fVar6 = -fVar5;
          if (-fVar5 <= fVar5) {
            fVar6 = fVar5;
          }
          if (fVar6 < 1e-05) {
            bVar3 = true;
            break;
          }
          pfVar1 = pfVar2;
        } while (pfVar2 != iStack_40._M_current);
        if (!bVar3) goto LAB_00d362cd;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < test_result->n_vertices);
  }
  test_result->n_isolines = (uint)((ulong)((long)iStack_40._M_current - (long)local_48) >> 2);
  if (local_48 != (float *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void TessellationShadersIsolines::countIsolines(_test_result& test_result)
{
	const float		   epsilon = 1e-5f;
	std::vector<float> found_ys;

	for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices; ++n_vertex)
	{
		bool		 was_y_found = false;
		const float* vertex		 = (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
		float		 vertex_y	= vertex[1];

		for (std::vector<float>::iterator found_ys_iterator = found_ys.begin(); found_ys_iterator != found_ys.end();
			 found_ys_iterator++)
		{
			float& found_y = *found_ys_iterator;

			if (de::abs(vertex_y - found_y) < epsilon)
			{
				was_y_found = true;

				break;
			}
		} /* for (all found Ys) */

		if (!was_y_found)
		{
			found_ys.push_back(vertex_y);
		}
	} /* for (all vertices) */

	/* Store the value */
	test_result.n_isolines = (unsigned int)found_ys.size();
}